

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::lu_solve(tetgenmesh *this,double (*lu) [4],int n,int *ps,double *b,int N)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double X [4];
  
  lVar2 = (long)(n + N);
  lVar1 = (long)N;
  for (lVar3 = lVar1; lVar4 = lVar1, lVar3 < lVar2; lVar3 = lVar3 + 1) {
    X[lVar3 + -1] = 0.0;
  }
  for (; lVar3 = lVar2, lVar4 < lVar2; lVar4 = lVar4 + 1) {
    dVar6 = 0.0;
    for (lVar3 = lVar1; lVar3 < lVar4 + lVar1; lVar3 = lVar3 + 1) {
      dVar6 = dVar6 + lu[ps[lVar4]][lVar3] * X[lVar3 + -1];
    }
    X[lVar4 + -1] = b[ps[lVar4]] - dVar6;
  }
  while (lVar1 < lVar3) {
    lVar4 = lVar3 + -1;
    dVar6 = 0.0;
    for (lVar5 = lVar3; lVar5 < lVar2; lVar5 = lVar5 + 1) {
      dVar6 = dVar6 + lu[ps[lVar4]][lVar5] * X[lVar5 + -1];
    }
    X[lVar3 + -2] = (X[lVar3 + -2] - dVar6) / lu[(long)ps[lVar4] + -1][lVar3 + 3];
    lVar3 = lVar4;
  }
  for (; lVar1 < lVar2; lVar1 = lVar1 + 1) {
    b[lVar1] = X[lVar1 + -1];
  }
  return;
}

Assistant:

void tetgenmesh::lu_solve(REAL lu[4][4], int n, int* ps, REAL* b, int N)
{
  int i, j;
  REAL X[4], dot;

  for (i = N; i < n + N; i++) X[i] = 0.0;

  // Vector reduction using U triangular matrix.
  for (i = N; i < n + N; i++) {
    dot = 0.0;
    for (j = N; j < i + N; j++)
      dot += lu[ps[i]][j] * X[j];
    X[i] = b[ps[i]] - dot;
  }

  // Back substitution, in L triangular matrix.
  for (i = n + N - 1; i >= N; i--) {
    dot = 0.0;
    for (j = i + 1; j < n + N; j++)
      dot += lu[ps[i]][j] * X[j];
    X[i] = (X[i] - dot) / lu[ps[i]][i];
  }

  for (i = N; i < n + N; i++) b[i] = X[i];
}